

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
::Chain_barcode_swap
          (Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
           *this,Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                 *toCopy)

{
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  *toCopy_local;
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  *this_local;
  
  Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  ::Chain_pairing(&this->
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                  ,&toCopy->
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                 );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->pivotToPosition_,&toCopy->pivotToPosition_);
  return;
}

Assistant:

Chain_barcode_swap(const Chain_barcode_swap& toCopy)
      : CP(static_cast<const CP&>(toCopy)), pivotToPosition_(toCopy.pivotToPosition_){}